

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int flags)

{
  byte bVar1;
  int iVar2;
  char cVar3;
  size_t rankValOrigin;
  DTableDesc DVar4;
  uint uVar5;
  HUF_DEltX2 *DTable_00;
  U32 *pUVar6;
  HUF_DTable *code;
  uint local_bc;
  U32 w_3;
  U32 *rankValPtr;
  U32 consumed;
  U32 minBits;
  U32 curr_1;
  U32 w_2;
  U32 nextRankVal;
  int rescale;
  U32 *rankVal0;
  U32 r;
  U32 w_1;
  U32 s;
  U32 curr;
  U32 nextRankStart;
  U32 w;
  HUF_ReadDTableX2_Workspace *wksp;
  U32 *rankStart;
  HUF_DEltX2 *dt;
  void *dtPtr;
  size_t iSize;
  U32 maxTableLog;
  DTableDesc dtd;
  U32 nbSymbols;
  U32 maxW;
  U32 tableLog;
  int flags_local;
  size_t wkspSize_local;
  void *workSpace_local;
  size_t srcSize_local;
  void *src_local;
  HUF_DTable *DTable_local;
  
  maxW = flags;
  _tableLog = wkspSize;
  wkspSize_local = (size_t)workSpace;
  workSpace_local = (void *)srcSize;
  srcSize_local = (size_t)src;
  src_local = DTable;
  DVar4 = HUF_getDTableDesc(DTable);
  rankValOrigin = wkspSize_local;
  iSize._0_4_ = (uint)DVar4 & 0xff;
  DTable_00 = (HUF_DEltX2 *)((long)src_local + 4);
  if (_tableLog < 0x84c) {
    DTable_local = (HUF_DTable *)0xffffffffffffffff;
  }
  else {
    pUVar6 = (U32 *)(wkspSize_local + 0x2a8);
    memset((void *)(wkspSize_local + 0x270),0,0x34);
    memset((void *)(rankValOrigin + 0x2a4),0,0x3c);
    if ((uint)iSize < 0xd) {
      code = (HUF_DTable *)
             HUF_readStats_wksp((BYTE *)(rankValOrigin + 0x3e0),0x100,(U32 *)(rankValOrigin + 0x270)
                                ,&maxTableLog,&nbSymbols,(void *)srcSize_local,
                                (size_t)workSpace_local,(void *)(rankValOrigin + 0x4e0),0x36c,maxW);
      uVar5 = ERR_isError((size_t)code);
      DTable_local = code;
      if (uVar5 == 0) {
        if ((uint)iSize < nbSymbols) {
          DTable_local = (HUF_DTable *)0xffffffffffffffd4;
        }
        else {
          if ((nbSymbols < 0xc) && (0xb < (uint)iSize)) {
            iSize._0_4_ = 0xb;
          }
          dtd.maxTableLog = (undefined1)nbSymbols;
          dtd.tableType = nbSymbols._1_1_;
          dtd.tableLog = nbSymbols._2_1_;
          dtd.reserved = nbSymbols._3_1_;
          while (*(int *)(rankValOrigin + 0x270 + (ulong)(uint)dtd * 4) == 0) {
            dtd = (DTableDesc)((int)dtd + -1);
          }
          s = 0;
          for (curr = 1; curr < (int)dtd + 1U; curr = curr + 1) {
            iVar2 = *(int *)(rankValOrigin + 0x270 + (ulong)curr * 4);
            pUVar6[curr] = s;
            s = iVar2 + s;
          }
          *pUVar6 = s;
          pUVar6[(int)dtd + 1] = s;
          for (r = 0; r < maxTableLog; r = r + 1) {
            bVar1 = *(byte *)(rankValOrigin + 0x3e0 + (ulong)r);
            uVar5 = pUVar6[bVar1];
            pUVar6[bVar1] = uVar5 + 1;
            *(char *)(rankValOrigin + 0x2e0 + (ulong)uVar5) = (char)r;
          }
          *pUVar6 = 0;
          curr_1 = 0;
          for (minBits = 1; minBits < (int)dtd + 1U; minBits = minBits + 1) {
            iVar2 = *(int *)(rankValOrigin + 0x270 + (ulong)minBits * 4);
            cVar3 = (char)minBits;
            *(U32 *)(rankValOrigin + (ulong)minBits * 4) = curr_1;
            curr_1 = (iVar2 << (cVar3 + ((char)(uint)iSize - (char)nbSymbols) + -1 & 0x1fU)) +
                     curr_1;
          }
          uVar5 = (nbSymbols + 1) - (int)dtd;
          for (rankValPtr._0_4_ = uVar5; (uint)rankValPtr < ((uint)iSize - uVar5) + 1;
              rankValPtr._0_4_ = (uint)rankValPtr + 1) {
            for (local_bc = 1; local_bc < (int)dtd + 1U; local_bc = local_bc + 1) {
              *(uint *)(rankValOrigin + (ulong)(uint)rankValPtr * 0x34 + (ulong)local_bc * 4) =
                   *(uint *)(rankValOrigin + (ulong)local_bc * 4) >> ((byte)(uint)rankValPtr & 0x1f)
              ;
            }
          }
          HUF_fillDTableX2(DTable_00,(uint)iSize,(sortedSymbol_t *)(rankValOrigin + 0x2e0),
                           (U32 *)(rankValOrigin + 0x2a4),(rankValCol_t *)rankValOrigin,(U32)dtd,
                           nbSymbols + 1);
          iSize._7_1_ = DVar4.reserved;
          iSize._4_4_ = CONCAT22(CONCAT11(iSize._7_1_,(char)(uint)iSize),
                                 CONCAT11(1,DVar4.maxTableLog));
          *(undefined4 *)src_local = iSize._4_4_;
        }
      }
    }
    else {
      DTable_local = (HUF_DTable *)0xffffffffffffffd4;
    }
  }
  return (size_t)DTable_local;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize, int flags)
{
    U32 tableLog, maxW, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    HUF_ReadDTableX2_Workspace* const wksp = (HUF_ReadDTableX2_Workspace*)workSpace;

    if (sizeof(*wksp) > wkspSize) return ERROR(GENERIC);

    rankStart = wksp->rankStart0 + 1;
    ZSTD_memset(wksp->rankStats, 0, sizeof(wksp->rankStats));
    ZSTD_memset(wksp->rankStart0, 0, sizeof(wksp->rankStart0));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* ZSTD_memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->weightList, HUF_SYMBOLVALUE_MAX + 1, wksp->rankStats, &nbSymbols, &tableLog, src, srcSize, wksp->calleeWksp, sizeof(wksp->calleeWksp), flags);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */
    if (tableLog <= HUF_DECODER_FAST_TABLELOG && maxTableLog > HUF_DECODER_FAST_TABLELOG) maxTableLog = HUF_DECODER_FAST_TABLELOG;

    /* find maxWeight */
    for (maxW = tableLog; wksp->rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 curr = nextRankStart;
            nextRankStart += wksp->rankStats[w];
            rankStart[w] = curr;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        rankStart[maxW+1] = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = wksp->weightList[s];
            U32 const r = rankStart[w]++;
            wksp->sortedSymbol[r].symbol = (BYTE)s;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = wksp->rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 curr = nextRankVal;
                nextRankVal += wksp->rankStats[w] << (w+rescale);
                rankVal0[w] = curr;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = wksp->rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   wksp->sortedSymbol,
                   wksp->rankStart0, wksp->rankVal, maxW,
                   tableLog+1);

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}